

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

bool xatlas::internal::Fit::EigenSolver3_QLAlgorithm(float (*mat) [3],float *diag,float *subd)

{
  ulong uVar1;
  float fVar2;
  float *pfVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  lVar4 = 0;
  uVar9 = 0;
  bVar13 = false;
  pfVar7 = subd;
  pfVar8 = diag;
LAB_001b080a:
  iVar5 = 0;
  do {
    lVar12 = 0;
    pfVar3 = *mat;
    do {
      pfVar10 = pfVar3;
      lVar6 = lVar12;
      if (lVar4 + 2 == lVar6) break;
      fVar15 = ABS((pfVar8 + lVar6)[1]) + ABS(pfVar8[lVar6]);
      lVar12 = lVar6 + 1;
      pfVar3 = pfVar10 + 1;
    } while ((ABS(pfVar7[lVar6]) + fVar15 != fVar15) ||
            (NAN(ABS(pfVar7[lVar6]) + fVar15) || NAN(fVar15)));
    if (lVar6 == 0) break;
    fVar15 = diag[uVar9];
    fVar14 = subd[uVar9];
    fVar17 = (diag[uVar9 + 1] - fVar15) / (fVar14 + fVar14);
    fVar18 = SQRT(fVar17 * fVar17 + 1.0);
    fVar16 = 0.0;
    fVar14 = fVar14 / ((float)((uint)-fVar18 & -(uint)(fVar17 < 0.0) |
                              ~-(uint)(fVar17 < 0.0) & (uint)fVar18) + fVar17) +
             (pfVar8[lVar6] - fVar15);
    if (uVar9 < (ulong)(lVar6 - lVar4)) {
      fVar17 = 1.0;
      uVar11 = lVar6 - lVar4;
      fVar15 = 1.0;
      do {
        fVar17 = fVar17 * subd[uVar11 - 1];
        if (ABS(fVar14) <= ABS(fVar17)) {
          fVar18 = fVar14 / fVar17;
          fVar19 = SQRT(fVar18 * fVar18 + 1.0);
          fVar14 = fVar17 * fVar19;
          fVar17 = 1.0 / fVar19;
          fVar18 = fVar18 * fVar17;
        }
        else {
          fVar17 = fVar17 / fVar14;
          fVar18 = SQRT(fVar17 * fVar17 + 1.0);
          fVar14 = fVar14 * fVar18;
          fVar18 = 1.0 / fVar18;
          fVar17 = fVar17 * fVar18;
        }
        uVar1 = uVar11 - 1;
        fVar15 = fVar15 * subd[uVar11 - 1];
        subd[uVar11] = fVar14;
        fVar19 = diag[uVar11] - fVar16;
        fVar14 = (diag[uVar1] - fVar19) * fVar17 + (fVar15 + fVar15) * fVar18;
        fVar16 = fVar17 * fVar14;
        diag[uVar11] = fVar19 + fVar16;
        lVar12 = 0;
        do {
          fVar19 = *(float *)((long)pfVar10 + lVar12 + -4);
          fVar2 = *(float *)((long)pfVar10 + lVar12);
          *(float *)((long)pfVar10 + lVar12) = fVar17 * fVar19 + fVar18 * fVar2;
          *(float *)((long)pfVar10 + lVar12 + -4) = fVar19 * fVar18 + fVar2 * -fVar17;
          lVar12 = lVar12 + 0xc;
        } while (lVar12 != 0x24);
        fVar14 = fVar14 * fVar18 + -fVar15;
        pfVar10 = pfVar10 + -1;
        uVar11 = uVar1;
        fVar15 = fVar18;
      } while ((long)uVar9 < (long)uVar1);
      fVar15 = diag[uVar9];
    }
    diag[uVar9] = fVar15 - fVar16;
    subd[uVar9] = fVar14;
    pfVar7[lVar6] = 0.0;
    iVar5 = iVar5 + 1;
    if (iVar5 == 0x20) {
      return bVar13;
    }
  } while( true );
  if (iVar5 == 0x20) {
    return bVar13;
  }
  bVar13 = 1 < uVar9;
  uVar9 = uVar9 + 1;
  lVar4 = lVar4 + -1;
  pfVar8 = pfVar8 + 1;
  pfVar7 = pfVar7 + 1;
  mat = (float (*) [3])((long)mat + 4);
  if (uVar9 == 3) {
    return bVar13;
  }
  goto LAB_001b080a;
}

Assistant:

static bool EigenSolver3_QLAlgorithm(float mat[3][3], float *diag, float *subd)
	{
		// QL iteration with implicit shifting to reduce matrix from tridiagonal
		// to diagonal
		const int maxiter = 32;
		for (int ell = 0; ell < 3; ell++) {
			int iter;
			for (iter = 0; iter < maxiter; iter++) {
				int m;
				for (m = ell; m <= 1; m++) {
					float dd = fabsf(diag[m]) + fabsf(diag[m + 1]);
					if ( fabsf(subd[m]) + dd == dd )
						break;
				}
				if ( m == ell )
					break;
				float g = (diag[ell + 1] - diag[ell]) / (2 * subd[ell]);
				float r = sqrtf(g * g + 1);
				if ( g < 0 )
					g = diag[m] - diag[ell] + subd[ell] / (g - r);
				else
					g = diag[m] - diag[ell] + subd[ell] / (g + r);
				float s = 1, c = 1, p = 0;
				for (int i = m - 1; i >= ell; i--) {
					float f = s * subd[i], b = c * subd[i];
					if ( fabsf(f) >= fabsf(g) ) {
						c = g / f;
						r = sqrtf(c * c + 1);
						subd[i + 1] = f * r;
						c *= (s = 1 / r);
					} else {
						s = f / g;
						r = sqrtf(s * s + 1);
						subd[i + 1] = g * r;
						s *= (c = 1 / r);
					}
					g = diag[i + 1] - p;
					r = (diag[i] - g) * s + 2 * b * c;
					p = s * r;
					diag[i + 1] = g + p;
					g = c * r - b;
					for (int k = 0; k < 3; k++) {
						f = mat[k][i + 1];
						mat[k][i + 1] = s * mat[k][i] + c * f;
						mat[k][i] = c * mat[k][i] - s * f;
					}
				}
				diag[ell] -= p;
				subd[ell] = g;
				subd[m] = 0;
			}
			if ( iter == maxiter )
				// should not get here under normal circumstances
				return false;
		}
		return true;
	}